

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O0

bool __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0>::insert_media
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0> *this,Media *media)

{
  bool bVar1;
  const_reference pvVar2;
  __shared_ptr<Storage::MassStorage::MassStorageDevice,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  DirectAccessDevice *this_01;
  const_reference device;
  undefined8 *local_50;
  Volume *volume;
  Media *media_local;
  ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0> *this_local;
  
  bVar1 = std::
          vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
          ::empty(&media->disks);
  if ((bVar1) &&
     (bVar1 = std::
              vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
              ::empty(&media->mass_storage_devices), bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = std::
            vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
            ::empty(&media->disks);
    if (!bVar1) {
      bVar1 = Storage::Disk::Drive::has_disk((Drive *)&this->field_0xe28);
      if (bVar1) {
        pvVar2 = std::
                 vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                 ::operator[](&media->disks,0);
        Storage::Disk::Drive::set_disk((Drive *)&this->field_0xfa0,pvVar2);
      }
      else {
        pvVar2 = std::
                 vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                 ::operator[](&media->disks,0);
        Storage::Disk::Drive::set_disk((Drive *)&this->field_0xe28,pvVar2);
      }
    }
    bVar1 = std::
            vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
            ::empty(&media->mass_storage_devices);
    if (!bVar1) {
      this_00 = &std::
                 vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
                 ::front(&media->mass_storage_devices)->
                 super___shared_ptr<Storage::MassStorage::MassStorageDevice,_(__gnu_cxx::_Lock_policy)2>
      ;
      peVar3 = std::
               __shared_ptr<Storage::MassStorage::MassStorageDevice,_(__gnu_cxx::_Lock_policy)2>::
               get(this_00);
      if (peVar3 == (element_type *)0x0) {
        local_50 = (undefined8 *)0x0;
      }
      else {
        local_50 = (undefined8 *)
                   __dynamic_cast(peVar3,&Storage::MassStorage::MassStorageDevice::typeinfo,
                                  &Storage::MassStorage::Encodings::Macintosh::Volume::typeinfo,
                                  0xfffffffffffffffe);
      }
      if (local_50 != (undefined8 *)0x0) {
        (**(code **)*local_50)(local_50,0);
      }
      this_01 = SCSI::Target::Target<SCSI::DirectAccessDevice>::operator->(&this->hard_drive_);
      device = std::
               vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
               ::front(&media->mass_storage_devices);
      SCSI::DirectAccessDevice::set_storage(this_01,device);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			if(media.disks.empty() && media.mass_storage_devices.empty())
				return false;

			// TODO: shouldn't allow disks to be replaced like this, as the Mac
			// uses software eject. Will need to expand messaging ability of
			// insert_media.
			if(!media.disks.empty()) {
				if(drives_[0].has_disk())
					drives_[1].set_disk(media.disks[0]);
				else
					drives_[0].set_disk(media.disks[0]);
			}

			// TODO: allow this only at machine startup?
			if(!media.mass_storage_devices.empty()) {
				const auto volume = dynamic_cast<Storage::MassStorage::Encodings::Macintosh::Volume *>(media.mass_storage_devices.front().get());
				if(volume) {
					volume->set_drive_type(Storage::MassStorage::Encodings::Macintosh::DriveType::SCSI);
				}
				hard_drive_->set_storage(media.mass_storage_devices.front());
			}

			return true;
		}